

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlnamePush(htmlParserCtxtPtr ctxt,xmlChar *value)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  xmlChar **ppxVar3;
  
  iVar2 = ctxt->html;
  if (iVar2 < 3) {
    iVar2 = xmlStrEqual(value,"head");
    if (iVar2 == 0) {
      iVar2 = ctxt->html;
      goto LAB_00150921;
    }
    ctxt->html = 3;
  }
  else {
LAB_00150921:
    if (9 < iVar2) goto LAB_00150940;
  }
  iVar2 = xmlStrEqual(value,"body");
  if (iVar2 != 0) {
    ctxt->html = 10;
  }
LAB_00150940:
  iVar2 = ctxt->nameNr;
  iVar1 = ctxt->nameMax;
  if (iVar2 < iVar1) {
    ppxVar3 = ctxt->nameTab;
  }
  else {
    ctxt->nameMax = iVar1 * 2;
    ppxVar3 = (xmlChar **)(*xmlRealloc)(ctxt->nameTab,(long)iVar1 << 4);
    ctxt->nameTab = ppxVar3;
    if (ppxVar3 == (xmlChar **)0x0) {
      htmlErrMemory(ctxt,(char *)0x0);
      return extraout_EAX;
    }
    iVar2 = ctxt->nameNr;
  }
  ppxVar3[iVar2] = value;
  ctxt->name = value;
  ctxt->nameNr = iVar2 + 1;
  return (int)ppxVar3;
}

Assistant:

static int
htmlnamePush(htmlParserCtxtPtr ctxt, const xmlChar * value)
{
    if ((ctxt->html < 3) && (xmlStrEqual(value, BAD_CAST "head")))
        ctxt->html = 3;
    if ((ctxt->html < 10) && (xmlStrEqual(value, BAD_CAST "body")))
        ctxt->html = 10;
    if (ctxt->nameNr >= ctxt->nameMax) {
        ctxt->nameMax *= 2;
        ctxt->nameTab = (const xmlChar * *)
                         xmlRealloc((xmlChar * *)ctxt->nameTab,
                                    ctxt->nameMax *
                                    sizeof(ctxt->nameTab[0]));
        if (ctxt->nameTab == NULL) {
            htmlErrMemory(ctxt, NULL);
            return (0);
        }
    }
    ctxt->nameTab[ctxt->nameNr] = value;
    ctxt->name = value;
    return (ctxt->nameNr++);
}